

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node *n,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  char *pcVar3;
  xpath_node local_30;
  
  pxVar1 = n->_root;
  if (pxVar1 == (xml_node_struct *)0x0) {
    return;
  }
  switch(this->_test) {
  case '\x01':
    if ((pxVar1->header & 7) != 1) {
      return;
    }
    goto LAB_00121eb8;
  case '\x02':
    break;
  case '\x03':
    if ((pxVar1->header & 7) != 4) {
      return;
    }
    break;
  case '\x04':
    if ((pxVar1->header & 7) != 5) {
      return;
    }
    break;
  case '\x05':
    if ((pxVar1->header & 6) != 2) {
      return;
    }
    break;
  case '\x06':
    if ((pxVar1->header & 7) != 5) {
      return;
    }
LAB_00121eb8:
    pcVar3 = "";
    if (pxVar1->name != (char_t *)0x0) {
      pcVar3 = pxVar1->name;
    }
    bVar2 = strequal(pcVar3,(this->_data).string);
    if (!bVar2) {
      return;
    }
    local_30._node = (xml_node)n->_root;
    goto LAB_00121efc;
  case '\a':
    if ((pxVar1->header & 7) != 1) {
      return;
    }
    break;
  case '\b':
    if ((pxVar1->header & 7) != 1) {
      return;
    }
    pcVar3 = "";
    if (pxVar1->name != (char_t *)0x0) {
      pcVar3 = pxVar1->name;
    }
    bVar2 = starts_with(pcVar3,(this->_data).string);
    if (!bVar2) {
      return;
    }
    break;
  default:
    __assert_fail("!\"Unknown axis\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0x1e00,
                  "void pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, const xml_node &, xpath_allocator *)"
                 );
  }
  local_30._node._root = pxVar1;
LAB_00121efc:
  local_30._attribute._attr = (xml_attribute_struct *)0x0;
  xpath_node_set_raw::push_back(ns,&local_30,alloc);
  return;
}

Assistant:

PUGI__FN bool xml_node::operator!() const
	{
		return !_root;
	}